

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.h
# Opt level: O0

Type __thiscall wasm::IRBuilder::ScopeCtx::getResultType(ScopeCtx *this)

{
  Function *pFVar1;
  Block *pBVar2;
  If *pIVar3;
  Loop *pLVar4;
  Try *pTVar5;
  TryTable *pTVar6;
  Signature SVar7;
  TryTable *trytable;
  Try *tryy_2;
  Try *tryy_1;
  Try *tryy;
  Loop *loop;
  If *iff_1;
  If *iff;
  Block *block;
  Type local_28;
  Function *func;
  ScopeCtx *this_local;
  
  pFVar1 = getFunction(this);
  if (pFVar1 == (Function *)0x0) {
    pBVar2 = getBlock(this);
    if (pBVar2 == (Block *)0x0) {
      pIVar3 = getIf(this);
      if (pIVar3 == (If *)0x0) {
        pIVar3 = getElse(this);
        if (pIVar3 == (If *)0x0) {
          pLVar4 = getLoop(this);
          if (pLVar4 == (Loop *)0x0) {
            pTVar5 = getTry(this);
            if (pTVar5 == (Try *)0x0) {
              pTVar5 = getCatch(this);
              if (pTVar5 == (Try *)0x0) {
                pTVar5 = getCatchAll(this);
                if (pTVar5 == (Try *)0x0) {
                  pTVar6 = getTryTable(this);
                  if (pTVar6 == (TryTable *)0x0) {
                    handle_unreachable("unexpected scope kind",
                                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-ir-builder.h"
                                       ,0x213);
                  }
                  this_local = (ScopeCtx *)
                               (pTVar6->super_SpecificExpression<(wasm::Expression::Id)53>).
                               super_Expression.type.id;
                }
                else {
                  this_local = (ScopeCtx *)
                               (pTVar5->super_SpecificExpression<(wasm::Expression::Id)52>).
                               super_Expression.type.id;
                }
              }
              else {
                this_local = (ScopeCtx *)
                             (pTVar5->super_SpecificExpression<(wasm::Expression::Id)52>).
                             super_Expression.type.id;
              }
            }
            else {
              this_local = (ScopeCtx *)
                           (pTVar5->super_SpecificExpression<(wasm::Expression::Id)52>).
                           super_Expression.type.id;
            }
          }
          else {
            this_local = (ScopeCtx *)
                         (pLVar4->super_SpecificExpression<(wasm::Expression::Id)3>).
                         super_Expression.type.id;
          }
        }
        else {
          this_local = (ScopeCtx *)
                       (pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                       type.id;
        }
      }
      else {
        this_local = (ScopeCtx *)
                     (pIVar3->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression.
                     type.id;
      }
    }
    else {
      this_local = (ScopeCtx *)
                   (pBVar2->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type
                   .id;
    }
  }
  else {
    SVar7 = HeapType::getSignature(&pFVar1->type);
    local_28 = SVar7.results.id;
    this_local = (ScopeCtx *)local_28.id;
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type getResultType() {
      if (auto* func = getFunction()) {
        return func->type.getSignature().results;
      }
      if (auto* block = getBlock()) {
        return block->type;
      }
      if (auto* iff = getIf()) {
        return iff->type;
      }
      if (auto* iff = getElse()) {
        return iff->type;
      }
      if (auto* loop = getLoop()) {
        return loop->type;
      }
      if (auto* tryy = getTry()) {
        return tryy->type;
      }
      if (auto* tryy = getCatch()) {
        return tryy->type;
      }
      if (auto* tryy = getCatchAll()) {
        return tryy->type;
      }
      if (auto* trytable = getTryTable()) {
        return trytable->type;
      }
      WASM_UNREACHABLE("unexpected scope kind");
    }